

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float __thiscall Imath_3_2::Vec2<float>::lengthTiny(Vec2<float> *this)

{
  int in_EDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar1;
  float max;
  float absY;
  float absX;
  undefined4 local_1c;
  undefined4 local_4;
  
  std::abs(in_EDI);
  std::abs(in_EDI);
  local_1c = extraout_XMM0_Da;
  if (extraout_XMM0_Da < extraout_XMM0_Da_00) {
    local_1c = extraout_XMM0_Da_00;
  }
  if ((local_1c != 0.0) || (NAN(local_1c))) {
    dVar1 = std::sqrt((double)(ulong)(uint)((extraout_XMM0_Da / local_1c) *
                                            (extraout_XMM0_Da / local_1c) +
                                           (extraout_XMM0_Da_00 / local_1c) *
                                           (extraout_XMM0_Da_00 / local_1c)));
    local_4 = local_1c * SUB84(dVar1,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec2<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = std::abs (x);
    T absY = std::abs (y);

    T max = absX;

    if (max < absY) max = absY;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;

    return max * std::sqrt (absX * absX + absY * absY);
}